

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O2

string * __thiscall
deqp::gls::ContextShaderProgram::genVertexSource_abi_cxx11_
          (string *__return_storage_ptr__,ContextShaderProgram *this,RenderContext *ctx,
          vector<deqp::gls::ContextArray_*,_std::allocator<deqp::gls::ContextArray_*>_> *arrays)

{
  code *pcVar1;
  bool bVar2;
  ContextType CVar3;
  uint uVar4;
  int iVar5;
  undefined4 uVar6;
  mapped_type *pmVar7;
  ostream *poVar8;
  OutputType type;
  int arrayNdx_1;
  char *pcVar9;
  int arrayNdx;
  long lVar10;
  key_type kStack_258;
  allocator<char> local_231;
  string local_230;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  params;
  char *local_1d8 [4];
  stringstream vertexShaderTmpl;
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&vertexShaderTmpl);
  params._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &params._M_t._M_impl.super__Rb_tree_header._M_header;
  params._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  params._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  params._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       params._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  CVar3.super_ApiType.m_bits =
       (ApiType)(*(this->super_ShaderProgram).super_VertexShader._vptr_VertexShader[2])(this);
  bVar2 = glu::isGLSLVersionSupported(CVar3,GLSL_VERSION_300_ES);
  if (bVar2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&kStack_258,"VTX_IN",(allocator<char> *)&local_230);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&params,&kStack_258);
    std::__cxx11::string::assign((char *)pmVar7);
    std::__cxx11::string::~string((string *)&kStack_258);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&kStack_258,"VTX_OUT",(allocator<char> *)&local_230);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&params,&kStack_258);
    std::__cxx11::string::assign((char *)pmVar7);
    std::__cxx11::string::~string((string *)&kStack_258);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&kStack_258,"FRAG_IN",(allocator<char> *)&local_230);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&params,&kStack_258);
    std::__cxx11::string::assign((char *)pmVar7);
    std::__cxx11::string::~string((string *)&kStack_258);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&kStack_258,"FRAG_COLOR",(allocator<char> *)&local_230);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&params,&kStack_258);
    std::__cxx11::string::assign((char *)pmVar7);
    std::__cxx11::string::~string((string *)&kStack_258);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&kStack_258,"VTX_HDR",(allocator<char> *)&local_230);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&params,&kStack_258);
    std::__cxx11::string::assign((char *)pmVar7);
    std::__cxx11::string::~string((string *)&kStack_258);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&kStack_258,"FRAG_HDR",(allocator<char> *)&local_230);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&params,&kStack_258);
    std::__cxx11::string::assign((char *)pmVar7);
  }
  else {
    CVar3.super_ApiType.m_bits =
         (ApiType)(*(this->super_ShaderProgram).super_VertexShader._vptr_VertexShader[2])(this);
    bVar2 = glu::isGLSLVersionSupported(CVar3,GLSL_VERSION_100_ES);
    if (bVar2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&kStack_258,"VTX_IN",(allocator<char> *)&local_230);
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&params,&kStack_258);
      std::__cxx11::string::assign((char *)pmVar7);
      std::__cxx11::string::~string((string *)&kStack_258);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&kStack_258,"VTX_OUT",(allocator<char> *)&local_230);
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&params,&kStack_258);
      std::__cxx11::string::assign((char *)pmVar7);
      std::__cxx11::string::~string((string *)&kStack_258);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&kStack_258,"FRAG_IN",(allocator<char> *)&local_230);
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&params,&kStack_258);
      std::__cxx11::string::assign((char *)pmVar7);
      std::__cxx11::string::~string((string *)&kStack_258);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&kStack_258,"FRAG_COLOR",(allocator<char> *)&local_230);
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&params,&kStack_258);
      std::__cxx11::string::assign((char *)pmVar7);
      std::__cxx11::string::~string((string *)&kStack_258);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&kStack_258,"VTX_HDR",(allocator<char> *)&local_230);
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&params,&kStack_258);
      std::__cxx11::string::assign((char *)pmVar7);
      std::__cxx11::string::~string((string *)&kStack_258);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&kStack_258,"FRAG_HDR",(allocator<char> *)&local_230);
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&params,&kStack_258);
      std::__cxx11::string::assign((char *)pmVar7);
    }
    else {
      CVar3.super_ApiType.m_bits =
           (ApiType)(*(this->super_ShaderProgram).super_VertexShader._vptr_VertexShader[2])(this);
      bVar2 = glu::isGLSLVersionSupported(CVar3,GLSL_VERSION_330);
      if (!bVar2) goto LAB_0084fdcb;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&kStack_258,"VTX_IN",(allocator<char> *)&local_230);
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&params,&kStack_258);
      std::__cxx11::string::assign((char *)pmVar7);
      std::__cxx11::string::~string((string *)&kStack_258);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&kStack_258,"VTX_OUT",(allocator<char> *)&local_230);
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&params,&kStack_258);
      std::__cxx11::string::assign((char *)pmVar7);
      std::__cxx11::string::~string((string *)&kStack_258);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&kStack_258,"FRAG_IN",(allocator<char> *)&local_230);
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&params,&kStack_258);
      std::__cxx11::string::assign((char *)pmVar7);
      std::__cxx11::string::~string((string *)&kStack_258);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&kStack_258,"FRAG_COLOR",(allocator<char> *)&local_230);
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&params,&kStack_258);
      std::__cxx11::string::assign((char *)pmVar7);
      std::__cxx11::string::~string((string *)&kStack_258);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&kStack_258,"VTX_HDR",(allocator<char> *)&local_230);
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&params,&kStack_258);
      std::__cxx11::string::assign((char *)pmVar7);
      std::__cxx11::string::~string((string *)&kStack_258);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&kStack_258,"FRAG_HDR",(allocator<char> *)&local_230);
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&params,&kStack_258);
      std::__cxx11::string::assign((char *)pmVar7);
    }
  }
  std::__cxx11::string::~string((string *)&kStack_258);
LAB_0084fdcb:
  std::operator<<(local_1a8,"${VTX_HDR}");
  for (lVar10 = 0;
      lVar10 < (int)((ulong)((long)ctx[1]._vptr_RenderContext - (long)ctx->_vptr_RenderContext) >> 3
                    ); lVar10 = lVar10 + 1) {
    poVar8 = std::operator<<(local_1a8,"${VTX_IN} highp ");
    uVar4 = (**(code **)(*(long *)ctx->_vptr_RenderContext[lVar10] + 0x50))();
    ContextArray::outputTypeToGLType_abi_cxx11_(&kStack_258,(ContextArray *)(ulong)uVar4,type);
    poVar8 = std::operator<<(poVar8,(string *)&kStack_258);
    poVar8 = std::operator<<(poVar8," a_");
    iVar5 = (**(code **)(*(long *)ctx->_vptr_RenderContext[lVar10] + 0x70))();
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar5);
    std::operator<<(poVar8,";\n");
    std::__cxx11::string::~string((string *)&kStack_258);
  }
  std::operator<<(local_1a8,
                  "uniform highp float u_coordScale;\nuniform highp float u_colorScale;\n${VTX_OUT} mediump vec4 v_color;\nvoid main(void)\n{\n\tgl_PointSize = 1.0;\n\thighp vec2 coord = vec2(1.0, 1.0);\n\thighp vec3 color = vec3(1.0, 1.0, 1.0);\n"
                 );
  lVar10 = 0;
  do {
    if ((int)((ulong)((long)ctx[1]._vptr_RenderContext - (long)ctx->_vptr_RenderContext) >> 3) <=
        lVar10) {
      std::operator<<(local_1a8,
                      "\tv_color = vec4(u_colorScale * color, 1.0);\n\tgl_Position = vec4(u_coordScale * coord, 1.0, 1.0);\n}\n"
                     );
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_230,local_1d8[0],&local_231);
      tcu::StringTemplate::StringTemplate((StringTemplate *)&kStack_258,&local_230);
      tcu::StringTemplate::specialize(__return_storage_ptr__,(StringTemplate *)&kStack_258,&params);
      tcu::StringTemplate::~StringTemplate((StringTemplate *)&kStack_258);
      std::__cxx11::string::~string((string *)&local_230);
      std::__cxx11::string::~string((string *)local_1d8);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&params._M_t);
      std::__cxx11::stringstream::~stringstream((stringstream *)&vertexShaderTmpl);
      return __return_storage_ptr__;
    }
    iVar5 = (**(code **)(*(long *)ctx->_vptr_RenderContext[lVar10] + 0x70))();
    pcVar1 = *(code **)(*(long *)ctx->_vptr_RenderContext[lVar10] + 0x50);
    if (iVar5 != 0) {
      uVar6 = (*pcVar1)();
      switch(uVar6) {
      case 0:
        poVar8 = std::operator<<(local_1a8,"\tcolor = color * a_");
        iVar5 = (**(code **)(*(long *)ctx->_vptr_RenderContext[lVar10] + 0x70))();
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar5);
        pcVar9 = ";\n";
        break;
      case 1:
        poVar8 = std::operator<<(local_1a8,"\tcolor.rg = color.rg * a_");
        iVar5 = (**(code **)(*(long *)ctx->_vptr_RenderContext[lVar10] + 0x70))();
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar5);
        pcVar9 = ".xy;\n";
        break;
      case 2:
        poVar8 = std::operator<<(local_1a8,"\tcolor = color.rgb * a_");
        iVar5 = (**(code **)(*(long *)ctx->_vptr_RenderContext[lVar10] + 0x70))();
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar5);
        pcVar9 = ".xyz;\n";
        break;
      case 3:
        poVar8 = std::operator<<(local_1a8,"\tcolor = color.rgb * a_");
        iVar5 = (**(code **)(*(long *)ctx->_vptr_RenderContext[lVar10] + 0x70))();
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar5);
        poVar8 = std::operator<<(poVar8,".xyz * a_");
        iVar5 = (**(code **)(*(long *)ctx->_vptr_RenderContext[lVar10] + 0x70))();
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar5);
        pcVar9 = ".w;\n";
        break;
      default:
        goto switchD_0084fef0_default;
      }
      goto switchD_0084ff45_caseD_0;
    }
    uVar6 = (*pcVar1)();
    pcVar9 = "\tcoord = vec2(a_0);\n";
    poVar8 = local_1a8;
    switch(uVar6) {
    case 0:
      break;
    case 1:
      pcVar9 = "\tcoord = a_0.xy;\n";
      break;
    case 2:
      pcVar9 = "\tcoord = a_0.xy;\n\tcoord.x = coord.x + a_0.z;\n";
      break;
    case 3:
      pcVar9 = "\tcoord = a_0.xy;\n\tcoord += a_0.zw;\n";
      break;
    default:
      goto switchD_0084fef0_default;
    case 6:
    case 9:
      pcVar9 = "\tcoord = vec2(a_0.xy);\n";
      break;
    case 7:
    case 10:
      pcVar9 = "\tcoord = vec2(a_0.xy);\n\tcoord.x = coord.x + float(a_0.z);\n";
      break;
    case 8:
    case 0xb:
      pcVar9 = "\tcoord = vec2(a_0.xy);\n\tcoord += vec2(a_0.zw);\n";
    }
switchD_0084ff45_caseD_0:
    std::operator<<(poVar8,pcVar9);
switchD_0084fef0_default:
    lVar10 = lVar10 + 1;
  } while( true );
}

Assistant:

std::string ContextShaderProgram::genVertexSource (const glu::RenderContext& ctx, const std::vector<ContextArray*>& arrays)
{
	std::stringstream vertexShaderTmpl;
	std::map<std::string, std::string> params;

	if (glu::isGLSLVersionSupported(ctx.getType(), glu::GLSL_VERSION_300_ES))
	{
		params["VTX_IN"]		= "in";
		params["VTX_OUT"]		= "out";
		params["FRAG_IN"]		= "in";
		params["FRAG_COLOR"]	= "dEQP_FragColor";
		params["VTX_HDR"]		= "#version 300 es\n";
		params["FRAG_HDR"]		= "#version 300 es\nlayout(location = 0) out mediump vec4 dEQP_FragColor;\n";
	}
	else if (glu::isGLSLVersionSupported(ctx.getType(), glu::GLSL_VERSION_100_ES))
	{
		params["VTX_IN"]		= "attribute";
		params["VTX_OUT"]		= "varying";
		params["FRAG_IN"]		= "varying";
		params["FRAG_COLOR"]	= "gl_FragColor";
		params["VTX_HDR"]		= "";
		params["FRAG_HDR"]		= "";
	}
	else if (glu::isGLSLVersionSupported(ctx.getType(), glu::GLSL_VERSION_330))
	{
		params["VTX_IN"]		= "in";
		params["VTX_OUT"]		= "out";
		params["FRAG_IN"]		= "in";
		params["FRAG_COLOR"]	= "dEQP_FragColor";
		params["VTX_HDR"]		= "#version 330\n";
		params["FRAG_HDR"]		= "#version 330\nlayout(location = 0) out mediump vec4 dEQP_FragColor;\n";
	}
	else
		DE_ASSERT(DE_FALSE);

	vertexShaderTmpl << "${VTX_HDR}";

	for (int arrayNdx = 0; arrayNdx < (int)arrays.size(); arrayNdx++)
	{
		vertexShaderTmpl
			<< "${VTX_IN} highp " <<  ContextArray::outputTypeToGLType(arrays[arrayNdx]->getOutputType()) << " a_" << arrays[arrayNdx]->getAttribNdx() << ";\n";
	}

	vertexShaderTmpl <<
		"uniform highp float u_coordScale;\n"
		"uniform highp float u_colorScale;\n"
		"${VTX_OUT} mediump vec4 v_color;\n"
		"void main(void)\n"
		"{\n"
		"\tgl_PointSize = 1.0;\n"
		"\thighp vec2 coord = vec2(1.0, 1.0);\n"
		"\thighp vec3 color = vec3(1.0, 1.0, 1.0);\n";

	for (int arrayNdx = 0; arrayNdx < (int)arrays.size(); arrayNdx++)
	{
		if (arrays[arrayNdx]->getAttribNdx() == 0)
		{
			switch (arrays[arrayNdx]->getOutputType())
			{
				case (Array::OUTPUTTYPE_FLOAT):
					vertexShaderTmpl <<
						"\tcoord = vec2(a_0);\n";
					break;

				case (Array::OUTPUTTYPE_VEC2):
					vertexShaderTmpl <<
						"\tcoord = a_0.xy;\n";
					break;

				case (Array::OUTPUTTYPE_VEC3):
					vertexShaderTmpl <<
						"\tcoord = a_0.xy;\n"
						"\tcoord.x = coord.x + a_0.z;\n";
					break;

				case (Array::OUTPUTTYPE_VEC4):
					vertexShaderTmpl <<
						"\tcoord = a_0.xy;\n"
						"\tcoord += a_0.zw;\n";
					break;

				case (Array::OUTPUTTYPE_IVEC2):
				case (Array::OUTPUTTYPE_UVEC2):
					vertexShaderTmpl <<
						"\tcoord = vec2(a_0.xy);\n";
					break;

				case (Array::OUTPUTTYPE_IVEC3):
				case (Array::OUTPUTTYPE_UVEC3):
					vertexShaderTmpl <<
						"\tcoord = vec2(a_0.xy);\n"
						"\tcoord.x = coord.x + float(a_0.z);\n";
					break;

				case (Array::OUTPUTTYPE_IVEC4):
				case (Array::OUTPUTTYPE_UVEC4):
					vertexShaderTmpl <<
						"\tcoord = vec2(a_0.xy);\n"
						"\tcoord += vec2(a_0.zw);\n";
					break;

				default:
					DE_ASSERT(false);
					break;
			}
			continue;
		}

		switch (arrays[arrayNdx]->getOutputType())
		{
			case (Array::OUTPUTTYPE_FLOAT):
				vertexShaderTmpl <<
					"\tcolor = color * a_" << arrays[arrayNdx]->getAttribNdx() << ";\n";
				break;

			case (Array::OUTPUTTYPE_VEC2):
				vertexShaderTmpl <<
					"\tcolor.rg = color.rg * a_" << arrays[arrayNdx]->getAttribNdx() << ".xy;\n";
				break;

			case (Array::OUTPUTTYPE_VEC3):
				vertexShaderTmpl <<
					"\tcolor = color.rgb * a_" << arrays[arrayNdx]->getAttribNdx() << ".xyz;\n";
				break;

			case (Array::OUTPUTTYPE_VEC4):
				vertexShaderTmpl <<
					"\tcolor = color.rgb * a_" << arrays[arrayNdx]->getAttribNdx() << ".xyz * a_" << arrays[arrayNdx]->getAttribNdx() << ".w;\n";
				break;

			default:
				DE_ASSERT(false);
				break;
		}
	}

	vertexShaderTmpl <<
		"\tv_color = vec4(u_colorScale * color, 1.0);\n"
		"\tgl_Position = vec4(u_coordScale * coord, 1.0, 1.0);\n"
		"}\n";

	return tcu::StringTemplate(vertexShaderTmpl.str().c_str()).specialize(params);
}